

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O1

bool __thiscall Yolact::isTargetObj(Yolact *this,int label,string *targetName)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)targetName);
  return iVar1 == 0;
}

Assistant:

bool Yolact::isTargetObj(int label, const std::string &targetName) 
{
    const char* class_names[] = {"background",
                                "person", "bicycle", "car", "motorcycle", "airplane", "bus",
                                "train", "truck", "boat", "traffic light", "fire hydrant",
                                "stop sign", "parking meter", "bench", "bird", "cat", "dog",
                                "horse", "sheep", "cow", "elephant", "bear", "zebra", "giraffe",
                                "backpack", "umbrella", "handbag", "tie", "suitcase", "frisbee",
                                "skis", "snowboard", "sports ball", "kite", "baseball bat",
                                "baseball glove", "skateboard", "surfboard", "tennis racket",
                                "bottle", "wine glass", "cup", "fork", "knife", "spoon", "bowl",
                                "banana", "apple", "sandwich", "orange", "broccoli", "carrot",
                                "hot dog", "pizza", "donut", "cake", "chair", "couch",
                                "potted plant", "bed", "dining table", "toilet", "tv", "laptop",
                                "mouse", "remote", "keyboard", "cell phone", "microwave", "oven",
                                "toaster", "sink", "refrigerator", "book", "clock", "vase",
                                "scissors", "teddy bear", "hair drier", "toothbrush"
                                };
    return (class_names[label] == targetName);
}